

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  intptr_t iVar6;
  FILE *__stream;
  char *pcVar7;
  FILE *__stream_00;
  size_t __n;
  size_t sVar8;
  int *piVar9;
  size_t i_1;
  int iVar10;
  char *pcVar11;
  char *__format;
  ulong uVar12;
  size_t i;
  long lVar13;
  bool bVar14;
  uint8_t *puVar15;
  size_t sStack_20e0;
  long local_20b8;
  long local_20a8;
  uint8_t tests_to_run [91];
  char bufn [4096];
  char buf1 [4096];
  
  pcVar11 = *argv;
  builtin_memcpy(tests_to_run + 0x50,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0xb);
  builtin_memcpy(tests_to_run + 0x40,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_memcpy(tests_to_run + 0x30,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_memcpy(tests_to_run + 0x20,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_memcpy(tests_to_run + 0x10,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
  builtin_memcpy(tests_to_run,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                 0x10);
  random_hash = ssh_hash_new(&ssh_sha256);
  bVar2 = 1;
  bVar4 = false;
  bVar14 = false;
  while (1 < argc) {
    iVar10 = argc + -1;
    pcVar7 = argv[1];
    ppcVar1 = argv + 1;
    if ((bool)(*pcVar7 == '-' & bVar2)) {
      if ((pcVar7[1] == 'O') && (pcVar7[2] == '\0')) {
        if (argc == 2) {
          pcVar11 = "\'-O\' expects a directory name\n";
          sStack_20e0 = 0x1e;
LAB_00106bbb:
          fwrite(pcVar11,sStack_20e0,1,_stderr);
          return 1;
        }
        outdir = argv[2];
        bVar2 = 1;
        argv = argv + 2;
        argc = argc + -2;
      }
      else if (((pcVar7[1] == 'k') && (pcVar7[2] == '\0')) ||
              (iVar5 = strcmp(pcVar7,"--keep"), iVar5 == 0)) {
        bVar14 = true;
        bVar2 = 1;
        argv = ppcVar1;
        argc = iVar10;
      }
      else if ((pcVar7[1] != '-') || (bVar2 = 0, argv = ppcVar1, argc = iVar10, pcVar7[2] != '\0'))
      {
        iVar10 = strcmp(pcVar7,"--help");
        if (iVar10 == 0) {
          printf("  usage: drrun -c test/sclog/libsclog.so -- %s -O <outdir>\n",pcVar11);
          puts("options: -O <outdir>           put log files in the specified directory");
          puts("         -k, --keep            do not delete log files for tests that passed");
          puts("   also: --help                display this text");
          return 0;
        }
        pcVar11 = "unknown command line option \'%s\'\n";
        goto LAB_00106b87;
      }
    }
    else {
      if (!bVar4) {
        tests_to_run[0x50] = '\0';
        tests_to_run[0x51] = '\0';
        tests_to_run[0x52] = '\0';
        tests_to_run[0x53] = '\0';
        tests_to_run[0x54] = '\0';
        tests_to_run[0x55] = '\0';
        tests_to_run[0x56] = '\0';
        tests_to_run[0x57] = '\0';
        tests_to_run[0x58] = '\0';
        tests_to_run[0x59] = '\0';
        tests_to_run[0x5a] = '\0';
        tests_to_run[0x40] = '\0';
        tests_to_run[0x41] = '\0';
        tests_to_run[0x42] = '\0';
        tests_to_run[0x43] = '\0';
        tests_to_run[0x44] = '\0';
        tests_to_run[0x45] = '\0';
        tests_to_run[0x46] = '\0';
        tests_to_run[0x47] = '\0';
        tests_to_run[0x48] = '\0';
        tests_to_run[0x49] = '\0';
        tests_to_run[0x4a] = '\0';
        tests_to_run[0x4b] = '\0';
        tests_to_run[0x4c] = '\0';
        tests_to_run[0x4d] = '\0';
        tests_to_run[0x4e] = '\0';
        tests_to_run[0x4f] = '\0';
        tests_to_run[0x30] = '\0';
        tests_to_run[0x31] = '\0';
        tests_to_run[0x32] = '\0';
        tests_to_run[0x33] = '\0';
        tests_to_run[0x34] = '\0';
        tests_to_run[0x35] = '\0';
        tests_to_run[0x36] = '\0';
        tests_to_run[0x37] = '\0';
        tests_to_run[0x38] = '\0';
        tests_to_run[0x39] = '\0';
        tests_to_run[0x3a] = '\0';
        tests_to_run[0x3b] = '\0';
        tests_to_run[0x3c] = '\0';
        tests_to_run[0x3d] = '\0';
        tests_to_run[0x3e] = '\0';
        tests_to_run[0x3f] = '\0';
        tests_to_run[0x20] = '\0';
        tests_to_run[0x21] = '\0';
        tests_to_run[0x22] = '\0';
        tests_to_run[0x23] = '\0';
        tests_to_run[0x24] = '\0';
        tests_to_run[0x25] = '\0';
        tests_to_run[0x26] = '\0';
        tests_to_run[0x27] = '\0';
        tests_to_run[0x28] = '\0';
        tests_to_run[0x29] = '\0';
        tests_to_run[0x2a] = '\0';
        tests_to_run[0x2b] = '\0';
        tests_to_run[0x2c] = '\0';
        tests_to_run[0x2d] = '\0';
        tests_to_run[0x2e] = '\0';
        tests_to_run[0x2f] = '\0';
        tests_to_run[0x10] = '\0';
        tests_to_run[0x11] = '\0';
        tests_to_run[0x12] = '\0';
        tests_to_run[0x13] = '\0';
        tests_to_run[0x14] = '\0';
        tests_to_run[0x15] = '\0';
        tests_to_run[0x16] = '\0';
        tests_to_run[0x17] = '\0';
        tests_to_run[0x18] = '\0';
        tests_to_run[0x19] = '\0';
        tests_to_run[0x1a] = '\0';
        tests_to_run[0x1b] = '\0';
        tests_to_run[0x1c] = '\0';
        tests_to_run[0x1d] = '\0';
        tests_to_run[0x1e] = '\0';
        tests_to_run[0x1f] = '\0';
        tests_to_run[0] = '\0';
        tests_to_run[1] = '\0';
        tests_to_run[2] = '\0';
        tests_to_run[3] = '\0';
        tests_to_run[4] = '\0';
        tests_to_run[5] = '\0';
        tests_to_run[6] = '\0';
        tests_to_run[7] = '\0';
        tests_to_run[8] = '\0';
        tests_to_run[9] = '\0';
        tests_to_run[10] = '\0';
        tests_to_run[0xb] = '\0';
        tests_to_run[0xc] = '\0';
        tests_to_run[0xd] = '\0';
        tests_to_run[0xe] = '\0';
        tests_to_run[0xf] = '\0';
      }
      puVar15 = tests_to_run;
      bVar3 = false;
      for (lVar13 = 0; lVar13 != 0x5b0; lVar13 = lVar13 + 0x10) {
        iVar5 = wc_match(pcVar7,*(char **)((long)&tests[0].testname + lVar13));
        if (iVar5 != 0) {
          *puVar15 = '\x01';
          bVar3 = true;
        }
        puVar15 = puVar15 + 1;
      }
      bVar4 = true;
      argv = ppcVar1;
      argc = iVar10;
      if (!bVar3) {
        pcVar11 = "no test name matched \'%s\'\n";
LAB_00106b87:
        fprintf(_stderr,pcVar11,pcVar7);
        return 1;
      }
    }
  }
  iVar6 = (*dry_run)();
  if (iVar6 == 0) {
    printf("Live run, main = %p\n",main);
    if (outdir == (char *)0x0) {
      pcVar11 = "expected -O <outdir> option\n";
      sStack_20e0 = 0x1c;
      goto LAB_00106bbb;
    }
    printf("Will write log files to %s\n");
  }
  else {
    puts("Dry run (DynamoRIO instrumentation not detected)");
  }
  local_20b8 = 0;
  local_20a8 = 0;
  lVar13 = 0;
  do {
    if (lVar13 == 0x5b) {
      (*random_hash->vt->free)(random_hash);
      if (local_20b8 != local_20a8) {
        printf("%zu tests failed\n");
        return 1;
      }
      puts("All tests passed");
      return 0;
    }
    if (tests_to_run[lVar13] != '\0') {
      pcVar11 = tests[lVar13].testname;
      printf("Running test %s ... ");
      fflush(_stdout);
      test_skipped = '\0';
      random_counter = 0;
      random_buf_limit = 0;
      test_index = 0;
      random_seedstr = pcVar11;
      test_basename = pcVar11;
      (*tests[lVar13].testfn)();
      if (test_skipped == '\x01') {
        pcVar11 = "skipped";
      }
      else {
        local_20b8 = local_20b8 + 1;
        if (iVar6 == 0) {
          if (1 < test_index) {
            pcVar11 = log_filename(test_basename,0);
            __stream = fopen(pcVar11,"rb");
            if (__stream == (FILE *)0x0) {
              piVar9 = __errno_location();
              pcVar7 = strerror(*piVar9);
              printf("ERR: %s: open: %s\n",pcVar11,pcVar7);
            }
            else {
              for (uVar12 = 1; uVar12 < test_index; uVar12 = uVar12 + 1) {
                pcVar7 = log_filename(test_basename,uVar12);
                __stream_00 = fopen(pcVar7,"rb");
                if (__stream_00 == (FILE *)0x0) {
                  piVar9 = __errno_location();
                  pcVar11 = strerror(*piVar9);
                  printf("ERR: %s: open: %s\n",pcVar7,pcVar11);
                  goto LAB_001068db;
                }
                rewind(__stream);
                while( true ) {
                  __n = fread(buf1,1,0x1000,__stream);
                  sVar8 = fread(bufn,1,0x1000,__stream_00);
                  if (__n != sVar8) {
                    __format = "FAIL: %s %s: different lengths\n";
                    goto LAB_00106a61;
                  }
                  if (__n == 0) break;
                  iVar10 = bcmp(buf1,bufn,__n);
                  if (iVar10 != 0) {
                    __format = "FAIL: %s %s: different content\n";
                    goto LAB_00106a61;
                  }
                }
                iVar10 = feof(__stream);
                if (iVar10 == 0) {
                  __format = "FAIL: %s %s: error at end of file\n";
LAB_00106a61:
                  printf(__format,pcVar11,pcVar7);
                  fclose(__stream_00);
                  safefree(pcVar7);
                  goto LAB_001068db;
                }
                iVar10 = feof(__stream_00);
                if (iVar10 == 0) {
                  __format = "FAIL: %s %s: error at end of file\n";
                  goto LAB_00106a61;
                }
                fclose(__stream_00);
                safefree(pcVar7);
              }
              fclose(__stream);
              safefree(pcVar11);
              puts("pass");
              local_20a8 = local_20a8 + 1;
              if (!bVar14) {
                for (uVar12 = 0; uVar12 < test_index; uVar12 = uVar12 + 1) {
                  pcVar11 = log_filename(test_basename,uVar12);
                  remove(pcVar11);
                  safefree(pcVar11);
                }
              }
            }
            goto LAB_001068db;
          }
          pcVar11 = "FAIL: test did not generate multiple output files";
        }
        else {
          pcVar11 = "dry run done";
        }
      }
      puts(pcVar11);
    }
LAB_001068db:
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    bool doing_opts = true;
    const char *pname = argv[0];
    uint8_t tests_to_run[lenof(tests)];
    bool keep_outfiles = false;
    bool test_names_given = false;

    memset(tests_to_run, 1, sizeof(tests_to_run));
    random_hash = ssh_hash_new(&ssh_sha256);

    while (--argc > 0) {
        char *p = *++argv;

        if (p[0] == '-' && doing_opts) {
            if (!strcmp(p, "-O")) {
                if (--argc <= 0) {
                    fprintf(stderr, "'-O' expects a directory name\n");
                    return 1;
                }
                outdir = *++argv;
            } else if (!strcmp(p, "-k") || !strcmp(p, "--keep")) {
                keep_outfiles = true;
            } else if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "--help")) {
                printf("  usage: drrun -c test/sclog/libsclog.so -- "
                       "%s -O <outdir>\n", pname);
                printf("options: -O <outdir>           "
                       "put log files in the specified directory\n");
                printf("         -k, --keep            "
                       "do not delete log files for tests that passed\n");
                printf("   also: --help                "
                       "display this text\n");
                return 0;
            } else {
                fprintf(stderr, "unknown command line option '%s'\n", p);
                return 1;
            }
        } else {
            if (!test_names_given) {
                test_names_given = true;
                memset(tests_to_run, 0, sizeof(tests_to_run));
            }
            bool found_one = false;
            for (size_t i = 0; i < lenof(tests); i++) {
                if (wc_match(p, tests[i].testname)) {
                    tests_to_run[i] = 1;
                    found_one = true;
                }
            }
            if (!found_one) {
                fprintf(stderr, "no test name matched '%s'\n", p);
                return 1;
            }
        }
    }

    bool is_dry_run = dry_run();

    if (is_dry_run) {
        printf("Dry run (DynamoRIO instrumentation not detected)\n");
    } else {
        /* Print the address of main() in this run. The idea is that
         * if this image is compiled to be position-independent, then
         * PC values in the logs won't match the ones you get if you
         * disassemble the binary, so it'll be harder to match up the
         * log messages to the code. But if you know the address of a
         * fixed (and not inlined) function in both worlds, you can
         * find out the offset between them. */
        printf("Live run, main = %p\n", (void *)main);

        if (!outdir) {
            fprintf(stderr, "expected -O <outdir> option\n");
            return 1;
        }
        printf("Will write log files to %s\n", outdir);
    }

    size_t nrun = 0, npass = 0;

    for (size_t i = 0; i < lenof(tests); i++) {
        bool keep_these_outfiles = true;

        if (!tests_to_run[i])
            continue;
        const struct test *test = &tests[i];
        printf("Running test %s ... ", test->testname);
        fflush(stdout);

        test_skipped = false;
        random_seed(test->testname);
        test_basename = test->testname;
        test_index = 0;

        test->testfn();

        if (test_skipped) {
            /* Used for e.g. tests of hardware-accelerated crypto when
             * the hardware acceleration isn't available */
            printf("skipped\n");
            continue;
        }

        nrun++;

        if (is_dry_run) {
            printf("dry run done\n");
            continue;                  /* test files won't exist anyway */
        }

        if (test_index < 2) {
            printf("FAIL: test did not generate multiple output files\n");
            goto test_done;
        }

        char *firstfile = log_filename(test_basename, 0);
        FILE *firstfp = fopen(firstfile, "rb");
        if (!firstfp) {
            printf("ERR: %s: open: %s\n", firstfile, strerror(errno));
            goto test_done;
        }
        for (size_t i = 1; i < test_index; i++) {
            char *nextfile = log_filename(test_basename, i);
            FILE *nextfp = fopen(nextfile, "rb");
            if (!nextfp) {
                printf("ERR: %s: open: %s\n", nextfile, strerror(errno));
                goto test_done;
            }

            rewind(firstfp);
            char buf1[4096], bufn[4096];
            bool compare_ok = false;
            while (true) {
                size_t r1 = fread(buf1, 1, sizeof(buf1), firstfp);
                size_t rn = fread(bufn, 1, sizeof(bufn), nextfp);
                if (r1 != rn) {
                    printf("FAIL: %s %s: different lengths\n",
                           firstfile, nextfile);
                    break;
                }
                if (r1 == 0) {
                    if (feof(firstfp) && feof(nextfp)) {
                        compare_ok = true;
                    } else {
                        printf("FAIL: %s %s: error at end of file\n",
                               firstfile, nextfile);
                    }
                    break;
                }
                if (memcmp(buf1, bufn, r1) != 0) {
                    printf("FAIL: %s %s: different content\n",
                           firstfile, nextfile);
                    break;
                }
            }
            fclose(nextfp);
            sfree(nextfile);
            if (!compare_ok) {
                goto test_done;
            }
        }
        fclose(firstfp);
        sfree(firstfile);

        printf("pass\n");
        npass++;
        keep_these_outfiles = keep_outfiles;

      test_done:
        if (!keep_these_outfiles) {
            for (size_t i = 0; i < test_index; i++) {
                char *file = log_filename(test_basename, i);
                remove(file);
                sfree(file);
            }
        }
    }

    ssh_hash_free(random_hash);

    if (npass == nrun) {
        printf("All tests passed\n");
        return 0;
    } else {
        printf("%"SIZEu" tests failed\n", nrun - npass);
        return 1;
    }
}